

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Body.h
# Opt level: O0

void __thiscall RigidBodyDynamics::FixedBody::FixedBody(FixedBody *this,FixedBody *param_2)

{
  SpatialTransform *in_RSI;
  SpatialTransform *in_RDI;
  
  (in_RDI->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[0] =
       (in_RSI->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  Vector3_t::Vector3_t((Vector3_t *)in_RSI,(Vector3_t *)in_RDI);
  Matrix3_t::Matrix3_t(&in_RSI->E,&in_RDI->E);
  *(undefined4 *)
   (in_RDI[1].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array + 1) =
       *(undefined4 *)
        (in_RSI[1].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array + 1);
  Math::SpatialTransform::SpatialTransform(in_RSI,in_RDI);
  Math::SpatialTransform::SpatialTransform(in_RSI,in_RDI);
  return;
}

Assistant:

struct RBDL_DLLAPI FixedBody {
	/// \brief The mass of the body
	double mMass;
	/// \brief The position of the center of mass in body coordinates
	Math::Vector3d mCenterOfMass;
	/// \brief The spatial inertia that contains both mass and inertia information
	Math::Matrix3d mInertia;

	/// \brief Id of the movable body that this fixed body is attached to.
	unsigned int mMovableParent;
	/// \brief Transforms spatial quantities expressed for the parent to the
	// fixed body. 
	Math::SpatialTransform mParentTransform;
	Math::SpatialTransform mBaseTransform;

	static FixedBody CreateFromBody (const Body& body) {
		FixedBody fbody;

		fbody.mMass = body.mMass;
		fbody.mCenterOfMass = body.mCenterOfMass;
		fbody.mInertia = body.mInertia;

		return fbody;
	}
}